

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-format.cc
# Opt level: O2

expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
tinyusdz::crate::GetCrateDataType_abi_cxx11_
          (expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,crate *this,int32_t type_id)

{
  const_iterator cVar1;
  size_t sVar2;
  CrateDataTypeId __val;
  char *pcVar3;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> arrmap;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
  tymap;
  unexpected_type<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_508;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4e8;
  string local_4c8;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL> local_4a8;
  map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
  local_3b0;
  
  memcpy(&local_3b0,&DAT_005a7ce0,0x390);
  memcpy(&local_4a8,&DAT_004784ec,0xf8);
  __val = (CrateDataTypeId)this;
  if ((int)__val < 0) {
    ::std::__cxx11::to_string(&local_4c8,__val);
    pcVar3 = "Unknown type id: ";
  }
  else {
    local_508.m_error._M_dataplus._M_p._0_4_ = __val;
    cVar1 = mapbox::eternal::impl::
            map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string>,_57UL>
            ::find(&local_3b0,(key_type *)&local_508);
    if (cVar1.pos !=
        (element<tinyusdz::crate::CrateDataTypeId,_mapbox::eternal::string> *)
        &stack0xffffffffffffffe0) {
      sVar2 = mapbox::eternal::impl::
              map<mapbox::eternal::impl::element<tinyusdz::crate::CrateDataTypeId,_bool>,_31UL>::
              count(&local_4a8,(key_type *)&local_508);
      pcVar3 = ((cVar1.pos)->pair).second.data_;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .m_has_value = true;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.name = pcVar3;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.dtype_id = __val;
      (__return_storage_ptr__->contained).
      super_storage_t_impl<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      .field_0.m_value.supports_array = sVar2 != 0;
      return __return_storage_ptr__;
    }
    ::std::__cxx11::to_string(&local_4c8,__val);
    pcVar3 = "Unknown or unspported type id: ";
  }
  ::std::operator+(&local_4e8,pcVar3,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_4c8);
  local_508.m_error._M_dataplus._M_p = (pointer)&local_508.m_error.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e8._M_dataplus._M_p == &local_4e8.field_2) {
    local_508.m_error.field_2._8_8_ = local_4e8.field_2._8_8_;
  }
  else {
    local_508.m_error._M_dataplus._M_p = local_4e8._M_dataplus._M_p;
  }
  local_508.m_error._M_string_length = local_4e8._M_string_length;
  local_4e8._M_string_length = 0;
  local_4e8.field_2._M_local_buf[0] = '\0';
  local_4e8._M_dataplus._M_p = (pointer)&local_4e8.field_2;
  nonstd::expected_lite::
  expected<tinyusdz::crate::CrateDataType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::expected<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
            (__return_storage_ptr__,&local_508);
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  ::std::__cxx11::string::_M_dispose();
  return __return_storage_ptr__;
}

Assistant:

nonstd::expected<CrateDataType, std::string> GetCrateDataType(int32_t type_id) {
  // See <pxrUSD>/pxr/usd/usd/crateDataTypes.h

  // TODO: Use type name in value-types.hh and prim-types.hh?
  MAPBOX_ETERNAL_CONSTEXPR const auto tymap =
      mapbox::eternal::map<CrateDataTypeId, mapbox::eternal::string>({
          {CrateDataTypeId::CRATE_DATA_TYPE_INVALID, "Invalid"},  // 0
          {CrateDataTypeId::CRATE_DATA_TYPE_BOOL, "Bool"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UCHAR, "UChar"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT, "Int"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT, "UInt"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64, "Int64"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64, "UInt64"},

          {CrateDataTypeId::CRATE_DATA_TYPE_HALF, "Half"},
          {CrateDataTypeId::CRATE_DATA_TYPE_FLOAT, "Float"},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE, "Double"},

          {CrateDataTypeId::CRATE_DATA_TYPE_STRING, "String"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN, "Token"},
          {CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH, "AssetPath"},

          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D, "Matrix2d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D, "Matrix3d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D, "Matrix4d"},

          {CrateDataTypeId::CRATE_DATA_TYPE_QUATD, "Quatd"},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATF, "Quatf"},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATH, "Quath"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2D, "Vec2d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2F, "Vec2f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2H, "Vec2h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2I, "Vec2i"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3D, "Vec3d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3F, "Vec3f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3H, "Vec3h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3I, "Vec3i"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4D, "Vec4d"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4F, "Vec4f"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4H, "Vec4h"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4I, "Vec4i"},

          // Non-array types.
          {CrateDataTypeId::CRATE_DATA_TYPE_DICTIONARY, "Dictionary"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_LIST_OP, "TokenListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_STRING_LIST_OP, "StringListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PATH_LIST_OP, "PathListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_REFERENCE_LIST_OP,
           "ReferenceListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT_LIST_OP, "IntListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64_LIST_OP, "Int64ListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT_LIST_OP, "UIntListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64_LIST_OP, "UInt64ListOp"},

          {CrateDataTypeId::CRATE_DATA_TYPE_PATH_VECTOR, "PathVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN_VECTOR, "TokenVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_SPECIFIER, "Specifier"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PERMISSION, "Permission"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VARIABILITY, "Variability"},

          {CrateDataTypeId::CRATE_DATA_TYPE_VARIANT_SELECTION_MAP,
           "VariantSelectionMap"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_SAMPLES, "TimeSamples"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD, "Payload"},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE_VECTOR, "DoubleVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_LAYER_OFFSET_VECTOR,
           "LayerOffsetVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_STRING_VECTOR, "StringVector"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VALUE_BLOCK, "ValueBlock"},
          {CrateDataTypeId::CRATE_DATA_TYPE_VALUE, "Value"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE,
           "UnregisteredValue"},
          {CrateDataTypeId::CRATE_DATA_TYPE_UNREGISTERED_VALUE_LIST_OP,
           "UnregisteredValueListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_PAYLOAD_LIST_OP, "PayloadListOp"},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE, "TimeCode"},
      });

  // List up `supports array` type.
  // TODO: Use compile-time `set`
  MAPBOX_ETERNAL_CONSTEXPR const auto arrmap =
      mapbox::eternal::map<CrateDataTypeId, bool>({
          {CrateDataTypeId::CRATE_DATA_TYPE_BOOL, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UCHAR, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_INT64, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_UINT64, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_HALF, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_FLOAT, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_DOUBLE, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_STRING, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_TOKEN, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_ASSET_PATH, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX2D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX3D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_MATRIX4D, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_QUATD, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATF, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_QUATH, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC2I, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC3I, true},

          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4D, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4F, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4H, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_VEC4I, true},
          {CrateDataTypeId::CRATE_DATA_TYPE_TIME_CODE, true},
      });

  if (type_id < 0) {
    return nonstd::make_unexpected("Unknown type id: " +
                                   std::to_string(type_id));
  }

  auto tyret = tymap.find(static_cast<CrateDataTypeId>(type_id));

  if (tyret == tymap.end()) {
    // Invalid or unsupported.
    return nonstd::make_unexpected("Unknown or unspported type id: " +
                                   std::to_string(type_id));
  }

  bool supports_array = arrmap.count(static_cast<CrateDataTypeId>(type_id));

  CrateDataType dst(tyret->second.data(), static_cast<CrateDataTypeId>(type_id),
                    supports_array);

  return std::move(dst);
}